

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

xmlNodePtr get_api_root(void)

{
  _xmlNode *p_Var1;
  
  if ((api_root == (xmlNodePtr)0x0) || (api_root->type != XML_ELEMENT_NODE)) {
    get_api_doc();
    if ((api_doc != (xmlDocPtr)0x0) &&
       (((api_doc->children != (_xmlNode *)0x0 &&
         (p_Var1 = api_doc->children->next, p_Var1 != (_xmlNode *)0x0)) &&
        (p_Var1->type == XML_ELEMENT_NODE)))) {
      api_root = p_Var1;
    }
  }
  return api_root;
}

Assistant:

static xmlNodePtr
get_api_root(void) {
    if ((api_root == NULL) || (api_root->type != XML_ELEMENT_NODE)) {
        get_api_doc();
	if ((api_doc != NULL) && (api_doc->children != NULL) &&
	    (api_doc->children->next != NULL) &&
	    (api_doc->children->next->type == XML_ELEMENT_NODE))
	    api_root = api_doc->children->next;
    }
    return(api_root);
}